

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

void __thiscall FOTerm::print(FOTerm *this,ostream *o)

{
  ostream *poVar1;
  size_type sVar2;
  char *pcVar3;
  pointer pFVar4;
  long lVar5;
  ulong uVar6;
  
  if (this->tag == Functor) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
    pFVar4 = (this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
        super__Vector_impl_data._M_finish != pFVar4) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        print((FOTerm *)
              ((long)&(pFVar4->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar5),o);
        uVar6 = uVar6 + 1;
        if (uVar6 < (ulong)((long)(this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 6)) {
          std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
        }
        pFVar4 = (this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x40;
      } while (uVar6 < (ulong)((long)(this->params).
                                     super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pFVar4 >> 6));
    }
    pcVar3 = ")";
    sVar2 = 1;
  }
  else {
    if (this->tag != Variable) {
      return;
    }
    pcVar3 = (this->name)._M_dataplus._M_p;
    sVar2 = (this->name)._M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar3,sVar2);
  return;
}

Assistant:

void print(std::ostream &o) {
        switch (tag) {
            case FOTermTag::Variable:
                o << name;
                return;
            case FOTermTag::Functor:
                o << name << "(";
                for (int i = 0; i < params.size(); ++i) {
                    params[i].print(o);
                    if (i + 1 < params.size()) o << ", ";
                }
                o << ")";
        }
    }